

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRGraphicsWindowNode.cpp
# Opt level: O2

void __thiscall MinVR::VRGraphicsWindowNode::~VRGraphicsWindowNode(VRGraphicsWindowNode *this)

{
  (this->super_VRDisplayNode)._vptr_VRDisplayNode =
       (_func_int **)&PTR__VRGraphicsWindowNode_0015d638;
  std::__cxx11::string::~string((string *)&(this->_settings).caption);
  VRDisplayNode::~VRDisplayNode(&this->super_VRDisplayNode);
  return;
}

Assistant:

VRGraphicsWindowNode::~VRGraphicsWindowNode() {
}